

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIExternalCommand::provideValueExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,uintptr_t inputID,
          BuildValue *value)

{
  llb_task_interface_t lVar1;
  llb_build_value *this_00;
  BuildValue local_b0;
  llb_build_value *local_40;
  llb_build_value *value_p;
  BuildValue *value_local;
  uintptr_t inputID_local;
  BuildSystem *system_local;
  CAPIExternalCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (CAPIExternalCommand *)ti.impl;
  value_p = (llb_build_value *)value;
  value_local = (BuildValue *)inputID;
  inputID_local = (uintptr_t)system;
  system_local = (BuildSystem *)this;
  this_00 = (llb_build_value *)operator_new(0x70);
  llbuild::buildsystem::BuildValue::BuildValue(&local_b0,(BuildValue *)value_p);
  CAPIBuildValue::CAPIBuildValue((CAPIBuildValue *)this_00,&local_b0);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_b0);
  lVar1.ctx = ti_local.impl;
  lVar1.impl = this_local;
  local_40 = this_00;
  (*(this->cAPIDelegate).provide_value)
            ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
             (llb_buildsystem_interface_t *)inputID_local,lVar1,this_00,(uintptr_t)value_local);
  return;
}

Assistant:

void provideValueExternalCommand(BuildSystem& system,
                                   core::TaskInterface ti,
                                   uintptr_t inputID,
                                   const BuildValue& value) override {
    auto value_p = (llb_build_value *)new CAPIBuildValue(BuildValue(value));
    cAPIDelegate.provide_value(cAPIDelegate.context,
                               (llb_buildsystem_command_t*)this,
                               (llb_buildsystem_interface_t*)&system,
                               *reinterpret_cast<llb_task_interface_t*>(&ti),
                               value_p,
                               inputID);
  }